

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCM_Parser.cpp
# Opt level: O3

h__WAVParser * __thiscall
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead
          (h__WAVParser *this,string *filename,Rational *PictureRate)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  Rational *in_RCX;
  SeekPos_t SVar4;
  SimpleAIFFHeader AIFFHeader;
  SimpleRF64Header RF64Header;
  SimpleWaveHeader WavHeader;
  SimpleAIFFHeader local_1c0;
  SimpleRF64Header local_1a8;
  SimpleRF64Header local_180 [3];
  SimpleWaveHeader local_118;
  Result_t local_f8 [104];
  Result_t local_90 [104];
  
  Kumu::FileReader::OpenRead((string *)this);
  if (-1 < *(int *)this) {
    local_118.data_len = 0;
    local_118.format = 0;
    local_118.nchannels = 0;
    local_118.samplespersec = 0;
    local_118.avgbps = 0;
    local_118.blockalign = 0;
    local_118.bitspersample = 0;
    local_118.cbsize = 0;
    Wav::SimpleWaveHeader::ReadFromFile
              ((SimpleWaveHeader *)local_180,(IFileReader *)&local_118,(ui32_t *)filename);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_180);
    Kumu::Result_t::~Result_t((Result_t *)local_180);
    SVar4 = (SeekPos_t)filename;
    if (*(int *)this < 0) {
      local_1c0.numChannels = 0;
      local_1c0.numSampleFrames = 0;
      local_1c0.sampleSize = 0;
      local_1c0.sampleRate[0] = '\0';
      local_1c0.sampleRate[1] = '\0';
      local_1c0.sampleRate[2] = '\0';
      local_1c0.sampleRate[3] = '\0';
      local_1c0.sampleRate[4] = '\0';
      local_1c0.sampleRate[5] = '\0';
      local_1c0.sampleRate[6] = '\0';
      local_1c0.sampleRate[7] = '\0';
      local_1c0.sampleRate[8] = '\0';
      local_1c0.sampleRate[9] = '\0';
      local_1c0.data_len = 0;
      Kumu::FileReader::Seek((long)local_90,SVar4);
      Kumu::Result_t::~Result_t(local_90);
      AIFF::SimpleAIFFHeader::ReadFromFile
                ((SimpleAIFFHeader *)local_180,(IFileReader *)&local_1c0,(ui32_t *)filename);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_180);
      Kumu::Result_t::~Result_t((Result_t *)local_180);
      if (*(int *)this < 0) {
        local_1a8.data_len = 0;
        local_1a8.format = 0;
        local_1a8.nchannels = 0;
        local_1a8.samplespersec = 0;
        local_1a8.avgbps = 0;
        local_1a8.blockalign = 0;
        local_1a8.bitspersample = 0;
        local_1a8.cbsize = 0;
        Kumu::FileReader::Seek((long)local_f8,SVar4);
        Kumu::Result_t::~Result_t(local_f8);
        RF64::SimpleRF64Header::ReadFromFile(local_180,(IFileReader *)&local_1a8,(ui32_t *)filename)
        ;
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_180);
        Kumu::Result_t::~Result_t((Result_t *)local_180);
        if (*(int *)this < 0) {
          return this;
        }
        RF64::SimpleRF64Header::FillADesc
                  (&local_1a8,(AudioDescriptor *)((long)&filename[2].field_2 + 8),*in_RCX);
        uVar3 = *(uint *)&filename[3].field_2;
        iVar1 = *(int *)((long)&filename[3]._M_string_length + 4);
        dVar2 = ceil(((double)*(int *)&filename[3]._M_dataplus._M_p /
                     (double)*(int *)((long)&filename[3]._M_dataplus._M_p + 4)) /
                     ((double)*(int *)((long)&filename[2].field_2 + 8) /
                     (double)*(int *)((long)&filename[2].field_2 + 0xc)));
        uVar3 = (int)(long)dVar2 * (uVar3 >> 3) * iVar1;
        *(uint *)&filename[2]._M_string_length = uVar3;
        *(ui64_t *)((long)&filename[1].field_2 + 8) = local_1a8.data_len;
        *(int *)&filename[4]._M_dataplus._M_p = (int)(local_1a8.data_len / uVar3);
        *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
        Kumu::FileReader::Seek((long)local_180,SVar4);
      }
      else {
        AIFF::SimpleAIFFHeader::FillADesc
                  (&local_1c0,(AudioDescriptor *)((long)&filename[2].field_2 + 8),*in_RCX);
        uVar3 = *(uint *)&filename[3].field_2;
        iVar1 = *(int *)((long)&filename[3]._M_string_length + 4);
        dVar2 = ceil(((double)*(int *)&filename[3]._M_dataplus._M_p /
                     (double)*(int *)((long)&filename[3]._M_dataplus._M_p + 4)) /
                     ((double)*(int *)((long)&filename[2].field_2 + 8) /
                     (double)*(int *)((long)&filename[2].field_2 + 0xc)));
        uVar3 = (int)(long)dVar2 * (uVar3 >> 3) * iVar1;
        *(uint *)&filename[2]._M_string_length = uVar3;
        *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)local_1c0.data_len;
        *(uint *)&filename[4]._M_dataplus._M_p = local_1c0.data_len / uVar3;
        *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
        Kumu::FileReader::Seek((long)local_180,SVar4);
      }
    }
    else {
      Wav::SimpleWaveHeader::FillADesc
                (&local_118,(AudioDescriptor *)((long)&filename[2].field_2 + 8),*in_RCX);
      uVar3 = *(uint *)&filename[3].field_2;
      iVar1 = *(int *)((long)&filename[3]._M_string_length + 4);
      dVar2 = ceil(((double)*(int *)&filename[3]._M_dataplus._M_p /
                   (double)*(int *)((long)&filename[3]._M_dataplus._M_p + 4)) /
                   ((double)*(int *)((long)&filename[2].field_2 + 8) /
                   (double)*(int *)((long)&filename[2].field_2 + 0xc)));
      uVar3 = (int)(long)dVar2 * (uVar3 >> 3) * iVar1;
      *(uint *)&filename[2]._M_string_length = uVar3;
      *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)local_118.data_len;
      *(uint *)&filename[4]._M_dataplus._M_p = local_118.data_len / uVar3;
      *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
      Kumu::FileReader::Seek((long)local_180,SVar4);
    }
    Kumu::Result_t::~Result_t((Result_t *)local_180);
    *(undefined4 *)((long)&filename[2]._M_string_length + 4) = 0;
    filename[2]._M_dataplus._M_p = (pointer)0x0;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead(const std::string& filename, const Rational& PictureRate)
{
  Result_t result = m_FileReader.OpenRead(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      SimpleWaveHeader WavHeader;
      result = WavHeader.ReadFromFile(m_FileReader, &m_DataStart);
  
      if ( ASDCP_SUCCESS(result) )
	{
	  WavHeader.FillADesc(m_ADesc, PictureRate);
	  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	  m_DataLength = WavHeader.data_len;
	  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	  m_ADesc.ChannelFormat = PCM::CF_NONE;
	  Reset();
	}
      else
	{
	  ASDCP::AIFF::SimpleAIFFHeader AIFFHeader;
	  m_FileReader.Seek(0);

      result = AIFFHeader.ReadFromFile(m_FileReader, &m_DataStart);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      AIFFHeader.FillADesc(m_ADesc, PictureRate);
	      m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	      m_DataLength = AIFFHeader.data_len;
	      m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	      m_ADesc.ChannelFormat = PCM::CF_NONE;
	      Reset();
	    }
	  else
	    {
	      SimpleRF64Header RF64Header;
	      m_FileReader.Seek(0);
          result = RF64Header.ReadFromFile(m_FileReader, &m_DataStart);

	      if ( ASDCP_SUCCESS(result) )
		{
		  RF64Header.FillADesc(m_ADesc, PictureRate);
		  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
		  m_DataLength = RF64Header.data_len;
		  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
		  m_ADesc.ChannelFormat = PCM::CF_NONE;
		  Reset();
		}
	    }
	}
    }

  return result;
}